

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR NpyArray::ParseFooterZIP
                 (FILE *fp,uint16_t *nrecs,size_t *globalHeaderSize,size_t *globalHeaderOffset)

{
  size_t sVar1;
  char *pcVar2;
  char footer [32];
  
  fseek((FILE *)fp,-0x16,2);
  sVar1 = fread(footer,1,0x16,(FILE *)fp);
  if (sVar1 == 0x16) {
    *nrecs = footer._10_2_;
    *globalHeaderSize = (ulong)(uint)footer._12_4_;
    *globalHeaderOffset = (ulong)(uint)footer._16_4_;
    pcVar2 = (LPCSTR)0x0;
  }
  else {
    pcVar2 = "error: failed footer";
  }
  return pcVar2;
}

Assistant:

LPCSTR NpyArray::ParseFooterZIP(FILE* fp, uint16_t& nrecs, size_t& globalHeaderSize, size_t& globalHeaderOffset)
{
	char footer[32];
	fseek(fp, -22, SEEK_END);
	if (fread(footer, sizeof(char), 22, fp) != 22)
		return "error: failed footer";
	const uint16_t diskNo = *(uint16_t*)(footer+4); ASSERT(diskNo == 0);
	const uint16_t diskStart = *(uint16_t*)(footer+6); ASSERT(diskStart == 0);
	const uint16_t nrecsOnDisk = *(uint16_t*)(footer+8);
	nrecs = *(uint16_t*)(footer+10); ASSERT(nrecsOnDisk == nrecs);
	globalHeaderSize = *(uint32_t*)(footer+12);
	globalHeaderOffset = *(uint32_t*)(footer+16);
	const uint16_t lenComment = *(uint16_t*)(footer+20); ASSERT(lenComment == 0);
	return NULL;
}